

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTable.h
# Opt level: O0

void __thiscall SymTable::SymTable(SymTable *this)

{
  SymTable *this_local;
  
  memset(this,0,0x10000);
  memset(this->m_implicitParams,0,0x20);
  this->m_propertyMap = (PropertyMap *)0x0;
  this->m_func = (Func *)0x0;
  this->m_currentID = 0;
  this->m_IDAdjustment = 0;
  return;
}

Assistant:

SymTable() :
        m_table{ nullptr },
        m_implicitParams{ nullptr },
        m_propertyMap(nullptr),
        m_func(nullptr),
        m_currentID(0),
        m_IDAdjustment(0)
    {
    }